

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O2

void decompressBlockTHUMB58Hc
               (uint block_part1,uint block_part2,uint8 *img,int width,int height,int startx,
               int starty,int channels)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  uint8 paint_colors [4] [3];
  uint8 colorsRGB444 [2] [3];
  uint8 colors [2] [3];
  
  colorsRGB444[0][0] = (byte)(block_part1 >> 0x16) & 0xf;
  colorsRGB444[0][1] = (byte)(block_part1 >> 0x12) & 0xf;
  colorsRGB444[0][2] = (byte)(block_part1 >> 0xe) & 0xf;
  colorsRGB444[1][0] = (byte)(block_part1 >> 10) & 0xf;
  colorsRGB444[1][1] = (byte)(block_part1 >> 6) & 0xf;
  colorsRGB444[1][2] = (byte)(block_part1 >> 2) & 0xf;
  decompressColor(4,4,4,colorsRGB444,colors);
  iVar6 = 0;
  calculatePaintColors58H
            ((block_part1 >> 2 & 0xfff) <= (block_part1 >> 0xe & 0xfff) |
             (char)block_part1 * '\x02' & 6U,'\0',colors,paint_colors);
  iVar2 = (width * starty + startx) * channels;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    iVar3 = iVar2;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      uVar5 = iVar6 + (int)lVar4;
      uVar5 = (uint)((block_part2 >> (uVar5 & 0x1f) & 1) != 0) +
              (block_part2 >> ((byte)uVar5 & 0x1f | 0x10) & 1) * 2;
      img[iVar3] = paint_colors[uVar5][0];
      img[(long)iVar3 + 1] = paint_colors[uVar5][1];
      img[(long)iVar3 + 2] = paint_colors[uVar5][2];
      iVar3 = iVar3 + channels * width;
    }
    iVar2 = iVar2 + channels;
    iVar6 = iVar6 + 4;
  }
  return;
}

Assistant:

void decompressBlockTHUMB58Hc(unsigned int block_part1, unsigned int block_part2, uint8 *img, int width, int height, int startx, int starty, int channels)
{
	unsigned int col0, col1;
	uint8 colors[2][3];
	uint8 colorsRGB444[2][3];
	uint8 paint_colors[4][3];
	uint8 distance;
	uint8 block_mask[4][4];
	
	// First decode left part of block.
	colorsRGB444[0][R]= GETBITSHIGH(block_part1, 4, 57);
	colorsRGB444[0][G]= GETBITSHIGH(block_part1, 4, 53);
	colorsRGB444[0][B]= GETBITSHIGH(block_part1, 4, 49);

	colorsRGB444[1][R]= GETBITSHIGH(block_part1, 4, 45);
	colorsRGB444[1][G]= GETBITSHIGH(block_part1, 4, 41);
	colorsRGB444[1][B]= GETBITSHIGH(block_part1, 4, 37);

	distance = 0;
	distance = (GETBITSHIGH(block_part1, 2, 33)) << 1;

	col0 = GETBITSHIGH(block_part1, 12, 57);
	col1 = GETBITSHIGH(block_part1, 12, 45);

	if(col0 >= col1)
	{
		distance |= 1;
	}

	// Extend the two colors to RGB888	
	decompressColor(R_BITS58H, G_BITS58H, B_BITS58H, colorsRGB444, colors);	
	
	calculatePaintColors58H(distance, PATTERN_H, colors, paint_colors);
	
	// Choose one of the four paint colors for each texel
	for (uint8 x = 0; x < BLOCKWIDTH; ++x) 
	{
		for (uint8 y = 0; y < BLOCKHEIGHT; ++y) 
		{
			//block_mask[x][y] = GETBITS(block_part2,2,31-(y*4+x)*2);
			block_mask[x][y] = GETBITS(block_part2,1,(y+x*4)+16)<<1;
			block_mask[x][y] |= GETBITS(block_part2,1,(y+x*4));
			img[channels*((starty+y)*width+startx+x)+R] =
				CLAMP(0,paint_colors[block_mask[x][y]][R],255); // RED
			img[channels*((starty+y)*width+startx+x)+G] =
				CLAMP(0,paint_colors[block_mask[x][y]][G],255); // GREEN
			img[channels*((starty+y)*width+startx+x)+B] =
				CLAMP(0,paint_colors[block_mask[x][y]][B],255); // BLUE
		}
	}
}